

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

void decrease_ref_count(RefCntBuffer *buf,BufferPool *pool)

{
  long in_RSI;
  int *in_RDI;
  
  if (((in_RDI != (int *)0x0) && (*in_RDI = *in_RDI + -1, *in_RDI == 0)) &&
     (*(long *)(in_RDI + 0x132) != 0)) {
    (**(code **)(in_RSI + 0x38))(*(undefined8 *)(in_RSI + 0x28),in_RDI + 0x132);
    in_RDI[0x132] = 0;
    in_RDI[0x133] = 0;
    in_RDI[0x134] = 0;
    in_RDI[0x135] = 0;
    in_RDI[0x136] = 0;
    in_RDI[0x137] = 0;
  }
  return;
}

Assistant:

static inline void decrease_ref_count(RefCntBuffer *const buf,
                                      BufferPool *const pool) {
  if (buf != NULL) {
    --buf->ref_count;
    // Reference counts should never become negative. If this assertion fails,
    // there is a bug in our reference count management.
    assert(buf->ref_count >= 0);
    // A worker may only get a free framebuffer index when calling get_free_fb.
    // But the raw frame buffer is not set up until we finish decoding header.
    // So if any error happens during decoding header, frame_bufs[idx] will not
    // have a valid raw frame buffer.
    if (buf->ref_count == 0 && buf->raw_frame_buffer.data) {
      pool->release_fb_cb(pool->cb_priv, &buf->raw_frame_buffer);
      buf->raw_frame_buffer.data = NULL;
      buf->raw_frame_buffer.size = 0;
      buf->raw_frame_buffer.priv = NULL;
    }
  }
}